

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

char * Wlc_PrsConvertInitValues(Wlc_Ntk_t *p)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar6;
  int *piVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  Wlc_Obj_t *pWVar14;
  int local_5c;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar4 = malloc(1000);
  *(void **)(__ptr + 2) = pvVar4;
  pVVar5 = p->vInits;
  if (pVVar5->nSize < 1) {
    uVar9 = 0;
  }
  else {
    lVar10 = 0;
    do {
      iVar3 = pVVar5->pArray[lVar10];
      if ((long)iVar3 < 0) {
        iVar3 = -iVar3;
        if (iVar3 < 2) {
          iVar3 = 1;
        }
        do {
          uVar9 = __ptr[1];
          if (uVar9 == *__ptr) {
            if ((int)uVar9 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x10);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = 0x10;
            }
            else {
              sVar11 = (ulong)uVar9 * 2;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(sVar11);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),sVar11);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = (uint)sVar11;
            }
          }
          else {
            pvVar4 = *(void **)(__ptr + 2);
          }
          __ptr[1] = uVar9 + 1;
          *(undefined1 *)((long)pvVar4 + (long)(int)uVar9) = 0x30;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        pVVar5 = p->vInits;
      }
      else {
        if ((iVar3 == 0) || (p->nObjsAlloc <= iVar3)) {
LAB_002ff873:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                        ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar14 = p->pObjs + iVar3;
        uVar9 = pWVar14->End;
        uVar1 = pWVar14->Beg;
        local_5c = (uVar9 - uVar1) + 1;
        while ((*(ushort *)pWVar14 & 0x3f) == 7) {
          paVar6 = &pWVar14->field_8;
          if (2 < pWVar14->nFanins) {
            paVar6 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)paVar6->pFanins[0];
          }
          iVar3 = paVar6->Fanins[0];
          if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_002ff873;
          pWVar14 = p->pObjs + iVar3;
        }
        if ((*(ushort *)pWVar14 & 0x3f) == 6) {
          piVar7 = (pWVar14->field_8).pFanins[0];
        }
        else {
          piVar7 = (int *)0x0;
        }
        iVar3 = (pWVar14->End - pWVar14->Beg) + 1;
        if (local_5c < iVar3) {
          iVar3 = local_5c;
        }
        if (iVar3 < 1) {
          uVar12 = 0;
        }
        else {
          uVar13 = 0;
          do {
            if (piVar7 == (int *)0x0) {
              bVar8 = 0x58;
            }
            else {
              bVar8 = ((uint)piVar7[uVar13 >> 5] >> ((uint)uVar13 & 0x1f) & 1) != 0 | 0x30;
            }
            uVar12 = __ptr[1];
            if (uVar12 == *__ptr) {
              if ((int)uVar12 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(0x10);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = 0x10;
              }
              else {
                sVar11 = (ulong)uVar12 * 2;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(sVar11);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),sVar11);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = (uint)sVar11;
              }
            }
            else {
              pvVar4 = *(void **)(__ptr + 2);
            }
            __ptr[1] = uVar12 + 1;
            *(byte *)((long)pvVar4 + (long)(int)uVar12) = bVar8;
            uVar12 = (uint)uVar13 + 1;
            uVar13 = (ulong)uVar12;
            iVar3 = (pWVar14->End - pWVar14->Beg) + 1;
            if (local_5c < iVar3) {
              iVar3 = local_5c;
            }
          } while ((int)uVar12 < iVar3);
        }
        if ((int)uVar12 < local_5c) {
          iVar3 = ~uVar9 + uVar12 + uVar1;
          do {
            uVar9 = __ptr[1];
            if (uVar9 == *__ptr) {
              if ((int)uVar9 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(0x10);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = 0x10;
              }
              else {
                sVar11 = (ulong)uVar9 * 2;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(sVar11);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),sVar11);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = (uint)sVar11;
              }
            }
            else {
              pvVar4 = *(void **)(__ptr + 2);
            }
            __ptr[1] = uVar9 + 1;
            *(undefined1 *)((long)pvVar4 + (long)(int)uVar9) = 0x30;
            iVar3 = iVar3 + 1;
          } while (iVar3 != 0);
        }
        pVVar5 = p->vInits;
        if (piVar7 == (int *)0x0) {
          if ((undefined1  [24])((undefined1  [24])*pWVar14 & (undefined1  [24])0x3d) !=
              (undefined1  [24])0x1) {
            __assert_fail("Wlc_ObjIsCi(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                          ,0xaa,"int Wlc_ObjCiId(Wlc_Obj_t *)");
          }
          local_5c = (pWVar14->field_8).Fanins[1];
        }
        else {
          local_5c = -local_5c;
        }
        if (pVVar5->nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar5->pArray[lVar10] = local_5c;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
    uVar1 = *__ptr;
    uVar9 = __ptr[1];
    if (uVar9 == uVar1) {
      if ((int)uVar1 < 0x10) {
        pvVar4 = *(void **)(__ptr + 2);
        if (pvVar4 == (void *)0x0) {
          sVar11 = 0x10;
          goto LAB_002ff845;
        }
        sVar11 = 0x10;
LAB_002ff834:
        pvVar4 = realloc(pvVar4,sVar11);
      }
      else {
        sVar11 = (ulong)uVar1 * 2;
        pvVar4 = *(void **)(__ptr + 2);
        if (pvVar4 != (void *)0x0) goto LAB_002ff834;
LAB_002ff845:
        pvVar4 = malloc(sVar11);
      }
      *(void **)(__ptr + 2) = pvVar4;
      goto LAB_002ff84e;
    }
  }
  pvVar4 = *(void **)(__ptr + 2);
LAB_002ff84e:
  *(undefined1 *)((long)pvVar4 + (long)(int)uVar9) = 0;
  pcVar2 = *(char **)(__ptr + 2);
  free(__ptr);
  return pcVar2;
}

Assistant:

char * Wlc_PrsConvertInitValues( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, Value, * pInits;
    char * pResult;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_IntForEachEntry( p->vInits, Value, i )
    {
        if ( Value < 0 )
        {
            for ( k = 0; k < -Value; k++ )
                Vec_StrPush( vStr, '0' );
            continue;
        }
        pObj = Wlc_NtkObj( p, Value );
        Value = Wlc_ObjRange(pObj);
        while ( pObj->Type == WLC_OBJ_BUF )
            pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
        pInits = pObj->Type == WLC_OBJ_CONST ? Wlc_ObjConstValue(pObj) : NULL;
        for ( k = 0; k < Abc_MinInt(Value, Wlc_ObjRange(pObj)); k++ )
            Vec_StrPush( vStr, (char)(pInits ? '0' + Abc_InfoHasBit((unsigned *)pInits, k) : 'X') );
        // extend values with zero, in case the init value signal has different range compared to constant used
        for ( ; k < Value; k++ )
            Vec_StrPush( vStr, '0' );
        // update vInits to contain either number of values or PI index
        Vec_IntWriteEntry( p->vInits, i, pInits ? -Value : Wlc_ObjCiId(pObj) );
    }
    Vec_StrPush( vStr, '\0' );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}